

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseIncoming.cpp
# Opt level: O0

Result __thiscall tonk::SessionIncoming::attemptDecode(SessionIncoming *this)

{
  undefined1 auVar1 [16];
  SiameseResult SVar2;
  char *pcVar3;
  long in_RSI;
  ErrorResult *in_RDI;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 in_ZMM1 [64];
  float failRate;
  uint64_t successCount;
  uint64_t solveFailCount;
  uint64_t stats [11];
  uint i;
  int decodeResult;
  uint recoveredOriginalCount;
  SiameseOriginalPacket *recoveredOriginals;
  int readyResult;
  Result *result;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  LogStringBuffer buffer_2;
  undefined4 in_stack_fffffffffffff2b8;
  uint in_stack_fffffffffffff2bc;
  LogStringBuffer *in_stack_fffffffffffff2c0;
  undefined4 in_stack_fffffffffffff2c8;
  ErrorType in_stack_fffffffffffff2cc;
  string *in_stack_fffffffffffff2d0;
  char *in_stack_fffffffffffff2d8;
  LogStringBuffer *pLVar6;
  ErrorResult *in_stack_fffffffffffff2e0;
  Result *in_stack_fffffffffffff2e8;
  LogStringBuffer *in_stack_fffffffffffff2f8;
  LogStringBuffer *buffer_00;
  OutputWorker *in_stack_fffffffffffff300;
  long lVar7;
  string local_bf8 [39];
  allocator local_bd1;
  string local_bd0 [35];
  undefined1 local_bad;
  float local_bac;
  ulong local_ba8;
  ulong local_ba0 [3];
  SessionIncoming *in_stack_fffffffffffff478;
  long local_b60;
  long local_b58;
  string local_b18 [55];
  allocator local_ae1;
  string local_ae0 [35];
  undefined1 local_abd;
  SiameseResult local_abc;
  long local_a98;
  undefined4 local_a8c;
  string *local_a88;
  char *local_a80;
  long local_a60;
  undefined4 local_a54;
  string *local_a50;
  char *local_a48;
  string *local_a30;
  char *local_a28;
  long local_a20;
  ulong *local_a18;
  char *local_a10;
  ulong *local_a08;
  char *local_a00;
  float *local_9f8;
  char *local_9f0;
  long local_9e8;
  string *local_9e0;
  char *local_9d8;
  LogStringBuffer *local_9d0;
  string *local_9c8;
  char *local_9c0;
  undefined4 local_9b4;
  long local_9b0;
  undefined4 local_9a4;
  long local_9a0;
  undefined1 local_988 [16];
  ostream aoStack_978 [376];
  string *local_800;
  char *local_7f8;
  undefined4 local_7ec;
  long local_7e8;
  string *local_7e0;
  char *local_7d8;
  string *local_7d0;
  undefined1 *local_7c8;
  long local_7c0;
  string *local_7b8;
  undefined1 *local_7b0;
  long local_7a8;
  string *local_7a0;
  undefined1 *local_798;
  string *local_790;
  char *local_788;
  undefined1 *local_780;
  long local_778;
  char *local_770;
  undefined1 *local_768;
  long local_760;
  string *local_758;
  undefined1 *local_750;
  long local_748;
  string *local_740;
  undefined1 *local_738;
  char *local_730;
  undefined1 *local_728;
  ulong *local_720;
  char *local_718;
  ulong *local_710;
  char *local_708;
  float *local_700;
  char *local_6f8;
  undefined4 local_6ec;
  long local_6e8;
  undefined4 local_6dc;
  long local_6d8;
  undefined1 local_6c0 [16];
  ostream aoStack_6b0 [376];
  ulong *local_538;
  char *local_530;
  ulong *local_528;
  char *local_520;
  float *local_518;
  char *local_510;
  undefined4 local_504;
  long local_500;
  ulong *local_4f8;
  char *local_4f0;
  ulong *local_4e8;
  char *local_4e0;
  float *local_4d8;
  char *local_4d0;
  string *local_4c8;
  undefined1 *local_4c0;
  long local_4b8;
  string *local_4b0;
  undefined1 *local_4a8;
  long local_4a0;
  string *local_498;
  undefined1 *local_490;
  ulong *local_488;
  char *local_480;
  ulong *local_478;
  char *local_470;
  float *local_468;
  char *local_460;
  undefined1 *local_458;
  long local_450;
  char *local_448;
  undefined1 *local_440;
  long local_438;
  ulong *local_430;
  char *local_428;
  ulong *local_420;
  char *local_418;
  float *local_410;
  undefined1 *local_408;
  long local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  float *local_3e8;
  undefined1 *local_3e0;
  long local_3d8;
  ulong *local_3d0;
  char *local_3c8;
  ulong *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  long local_3a8;
  float *local_3a0;
  undefined1 *local_398;
  char *local_390;
  undefined1 *local_388;
  long local_380;
  ulong *local_378;
  char *local_370;
  ulong *local_368;
  undefined1 *local_360;
  long local_358;
  ulong *local_350;
  undefined1 *local_348;
  long local_340;
  ulong *local_338;
  undefined1 *local_330;
  char *local_328;
  undefined1 *local_320;
  ulong *local_318;
  char *local_310;
  undefined1 *local_308;
  long local_300;
  ulong *local_2f8;
  undefined1 *local_2f0;
  long local_2e8;
  ulong *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  long local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  string *local_2a8;
  char *local_2a0;
  undefined4 local_294;
  LogStringBuffer *local_290;
  undefined4 local_284;
  LogStringBuffer *local_280;
  undefined1 local_268 [16];
  ostream aoStack_258 [376];
  string *local_e0;
  char *local_d8;
  undefined4 local_cc;
  LogStringBuffer *local_c8;
  string *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  LogStringBuffer *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  LogStringBuffer *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  string *local_70;
  char *local_68;
  undefined1 *local_60;
  LogStringBuffer *local_58;
  string *local_50;
  undefined1 *local_48;
  LogStringBuffer *local_40;
  string *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  LogStringBuffer *local_18;
  char *local_10;
  undefined1 *local_8;
  
  do {
    local_abc = siamese_decoder_is_ready
                          ((SiameseDecoder)
                           CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
    if (local_abc == Siamese_NeedMoreData) {
LAB_0016eb78:
      Result::Success();
      return (Result)in_RDI;
    }
    if (local_abc != Siamese_Success) {
      local_abd = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ae0,"siamese_decoder_is_ready failed",&local_ae1);
      local_a98 = (long)(int)local_abc;
      local_a80 = "SessionIncoming::decoderAddOriginal";
      local_a88 = local_ae0;
      local_a8c = 1;
      pcVar3 = (char *)operator_new(0x38);
      ErrorResult::ErrorResult
                (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8,in_stack_fffffffffffff2d0,
                 in_stack_fffffffffffff2cc,(ErrorCodeT)in_stack_fffffffffffff2c0);
      in_RDI->Source = pcVar3;
      std::__cxx11::string::~string(local_ae0);
      std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
      lVar7 = *(long *)(in_RSI + 0x28);
      Result::ToJson_abi_cxx11_(in_stack_fffffffffffff2e8);
      local_a28 = "siamese_decoder_is_ready failed: ";
      local_a30 = local_b18;
      local_9b4 = 4;
      local_9c0 = "siamese_decoder_is_ready failed: ";
      local_9a4 = 4;
      local_a20 = lVar7;
      local_9c8 = local_a30;
      local_9b0 = lVar7;
      local_9a0 = lVar7;
      if (*(int *)(lVar7 + 8) < 5) {
        local_7ec = 4;
        local_7f8 = "siamese_decoder_is_ready failed: ";
        local_800 = local_a30;
        local_7e8 = lVar7;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffff2c0,
                   (char *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8),Trace);
        local_7d0 = (string *)(lVar7 + 0x38);
        local_7c8 = local_988;
        local_7d8 = local_7f8;
        local_7e0 = local_800;
        local_7c0 = lVar7;
        local_7b8 = local_7d0;
        local_7b0 = local_7c8;
        local_7a8 = lVar7;
        local_7a0 = local_7d0;
        local_798 = local_7c8;
        std::operator<<(aoStack_978,local_7d0);
        local_780 = local_7c8;
        local_788 = local_7d8;
        local_790 = local_7e0;
        local_768 = local_7c8;
        local_770 = local_7d8;
        local_728 = local_7c8;
        local_730 = local_7d8;
        local_778 = lVar7;
        local_760 = lVar7;
        std::operator<<((ostream *)(local_7c8 + 0x10),local_7d8);
        local_750 = local_780;
        local_758 = local_790;
        local_738 = local_780;
        local_740 = local_790;
        local_748 = lVar7;
        std::operator<<((ostream *)(local_780 + 0x10),local_790);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x16db05);
      }
      std::__cxx11::string::~string(local_b18);
      return (Result)in_RDI;
    }
    SVar2 = siamese_decode((SiameseDecoder)
                           CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
                           (SiameseOriginalPacket **)in_stack_fffffffffffff2c0,
                           (uint *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    auVar5 = in_ZMM1._0_16_;
    if (SVar2 == Siamese_NeedMoreData) {
      siamese_decoder_stats
                ((SiameseDecoder)CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
                 (uint64_t *)in_stack_fffffffffffff2c0,in_stack_fffffffffffff2bc);
      local_bac = 0.0;
      if (local_b58 != 0) {
        auVar1 = vcvtusi2ss_avx512f((undefined1  [16])0x0,local_b58);
        auVar5 = vcvtusi2ss_avx512f(auVar5,local_b58 + local_b60);
        local_bac = auVar1._0_4_ / auVar5._0_4_;
      }
      lVar7 = *(long *)(in_RSI + 0x28);
      local_9f0 = "Recovery failed and needs more data (rare): Failure rate = ";
      local_9f8 = &local_bac;
      local_a00 = " solveFailCount=";
      local_a08 = local_ba0;
      local_a10 = " successCount = ";
      local_a18 = &local_ba8;
      local_6ec = 1;
      local_6f8 = "Recovery failed and needs more data (rare): Failure rate = ";
      local_708 = " solveFailCount=";
      local_718 = " successCount = ";
      local_6dc = 1;
      local_9e8 = lVar7;
      local_720 = local_a18;
      local_710 = local_a08;
      local_700 = local_9f8;
      local_6e8 = lVar7;
      local_6d8 = lVar7;
      if (*(int *)(lVar7 + 8) < 2) {
        local_504 = 1;
        local_510 = "Recovery failed and needs more data (rare): Failure rate = ";
        local_520 = " solveFailCount=";
        local_530 = " successCount = ";
        local_538 = local_a18;
        local_528 = local_a08;
        local_518 = local_9f8;
        local_500 = lVar7;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffff2c0,
                   (char *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8),Trace);
        local_4c8 = (string *)(lVar7 + 0x38);
        local_4d0 = local_510;
        local_4d8 = local_518;
        local_4e0 = local_520;
        local_4e8 = local_528;
        local_4f0 = local_530;
        local_4f8 = local_538;
        local_4c0 = local_6c0;
        local_4b8 = lVar7;
        local_4b0 = local_4c8;
        local_4a8 = local_6c0;
        local_4a0 = lVar7;
        local_498 = local_4c8;
        local_490 = local_6c0;
        std::operator<<(aoStack_6b0,local_4c8);
        local_458 = local_4c0;
        local_460 = local_4d0;
        local_468 = local_4d8;
        local_470 = local_4e0;
        local_478 = local_4e8;
        local_480 = local_4f0;
        local_488 = local_4f8;
        local_440 = local_4c0;
        local_448 = local_4d0;
        local_3f0 = local_4c0;
        local_3f8 = local_4d0;
        local_450 = lVar7;
        local_438 = lVar7;
        std::operator<<((ostream *)(local_4c0 + 0x10),local_4d0);
        local_408 = local_458;
        local_410 = local_468;
        local_418 = local_470;
        local_420 = local_478;
        local_428 = local_480;
        local_430 = local_488;
        local_3e0 = local_458;
        local_3e8 = local_468;
        local_398 = local_458;
        local_3a0 = local_468;
        local_400 = lVar7;
        local_3d8 = lVar7;
        std::ostream::operator<<((ostream *)(local_458 + 0x10),*local_468);
        local_3b0 = local_408;
        local_3b8 = local_418;
        local_3c0 = local_420;
        local_3c8 = local_428;
        local_3d0 = local_430;
        local_388 = local_408;
        local_390 = local_418;
        local_320 = local_408;
        local_328 = local_418;
        local_3a8 = lVar7;
        local_380 = lVar7;
        std::operator<<((ostream *)(local_408 + 0x10),local_418);
        local_360 = local_3b0;
        local_368 = local_3c0;
        local_370 = local_3c8;
        local_378 = local_3d0;
        local_348 = local_3b0;
        local_350 = local_3c0;
        local_330 = local_3b0;
        local_338 = local_3c0;
        local_358 = lVar7;
        local_340 = lVar7;
        std::ostream::operator<<((ostream *)(local_3b0 + 0x10),*local_3c0);
        local_308 = local_360;
        local_310 = local_370;
        local_318 = local_378;
        local_2c8 = local_360;
        local_2d0 = local_370;
        local_2b0 = local_360;
        local_2b8 = local_370;
        local_300 = lVar7;
        local_2c0 = lVar7;
        std::operator<<((ostream *)(local_360 + 0x10),local_370);
        local_2f0 = local_308;
        local_2f8 = local_318;
        local_2d8 = local_308;
        local_2e0 = local_318;
        local_2e8 = lVar7;
        std::ostream::operator<<((ostream *)(local_308 + 0x10),*local_318);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x16e53a);
      }
      goto LAB_0016eb78;
    }
    if (SVar2 != Siamese_Success) {
      local_bad = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_bd0,"siamese_decode failed",&local_bd1);
      local_a60 = (long)(int)SVar2;
      local_a48 = "SessionIncoming::decoderAddOriginal";
      local_a50 = local_bd0;
      local_a54 = 1;
      pcVar3 = (char *)operator_new(0x38);
      ErrorResult::ErrorResult
                (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8,in_stack_fffffffffffff2d0,
                 in_stack_fffffffffffff2cc,(ErrorCodeT)in_stack_fffffffffffff2c0);
      in_RDI->Source = pcVar3;
      std::__cxx11::string::~string(local_bd0);
      std::allocator<char>::~allocator((allocator<char> *)&local_bd1);
      pLVar6 = *(LogStringBuffer **)(in_RSI + 0x28);
      Result::ToJson_abi_cxx11_(in_stack_fffffffffffff2e8);
      local_9d8 = "siamese_decode failed: ";
      local_9e0 = local_bf8;
      local_294 = 4;
      local_2a0 = "siamese_decode failed: ";
      local_284 = 4;
      local_9d0 = pLVar6;
      local_2a8 = local_9e0;
      local_290 = pLVar6;
      local_280 = pLVar6;
      if ((int)pLVar6->LogLevel < 5) {
        local_cc = 4;
        local_d8 = "siamese_decode failed: ";
        buffer_00 = pLVar6;
        local_e0 = local_9e0;
        local_c8 = pLVar6;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffff2c0,
                   (char *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8),Trace);
        local_b0 = &pLVar6->field_0x38;
        local_a8 = local_268;
        local_b8 = local_d8;
        local_c0 = local_e0;
        local_a0 = pLVar6;
        local_98 = local_b0;
        local_90 = local_a8;
        local_88 = pLVar6;
        local_80 = local_b0;
        local_78 = local_a8;
        std::operator<<(aoStack_258,(string *)local_b0);
        local_60 = local_a8;
        local_68 = local_b8;
        local_70 = local_c0;
        local_20 = local_a8;
        local_28 = local_b8;
        local_8 = local_a8;
        local_10 = local_b8;
        local_58 = pLVar6;
        local_18 = pLVar6;
        std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
        local_48 = local_60;
        local_50 = local_70;
        local_30 = local_60;
        local_38 = local_70;
        local_40 = pLVar6;
        std::operator<<((ostream *)(local_60 + 0x10),local_70);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_fffffffffffff300,buffer_00);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x16e9e6);
      }
      std::__cxx11::string::~string(local_bf8);
      return (Result)in_RDI;
    }
    resumeProcessing(in_stack_fffffffffffff478);
    bVar4 = in_RDI->Source != (char *)0x0;
    in_stack_fffffffffffff2bc = CONCAT13(bVar4,(int3)in_stack_fffffffffffff2bc);
    if (bVar4) {
      return (Result)in_RDI;
    }
    Result::~Result((Result *)in_stack_fffffffffffff2c0);
  } while( true );
}

Assistant:

Result SessionIncoming::attemptDecode()
{
    // Run decode loop
    for (;;)
    {
        // Check if decoder is ready
        const int readyResult = siamese_decoder_is_ready(FECDecoder);

        if (readyResult == Siamese_NeedMoreData) {
            break;
        }

        if (readyResult != Siamese_Success)
        {
            Result result = Result("SessionIncoming::decoderAddOriginal", "siamese_decoder_is_ready failed", ErrorType::Siamese, readyResult);
            Deps.Logger->Error("siamese_decoder_is_ready failed: ", result.ToJson());
            return result;
        }

        SiameseOriginalPacket* recoveredOriginals = nullptr;
        unsigned recoveredOriginalCount = 0;

        // Attempt to decode
        const int decodeResult = siamese_decode(FECDecoder, &recoveredOriginals, &recoveredOriginalCount);

        // Handle any Unordered/Unreliable messages as they are decoded
        for (unsigned i = 0; i < recoveredOriginalCount; ++i) {
            onSiameseSolved(recoveredOriginals[i]);
        }

        if (decodeResult == Siamese_NeedMoreData)
        {
            uint64_t stats[SiameseDecoderStats_Count];
            siamese_decoder_stats(FECDecoder, stats, SiameseDecoderStats_Count);

            uint64_t solveFailCount = stats[SiameseDecoderStats_SolveFailCount];
            uint64_t successCount = stats[SiameseDecoderStats_SolveSuccessCount];

            float failRate = 0.f;
            if (solveFailCount > 0) {
                failRate = solveFailCount / (float)(solveFailCount + successCount);
            }
            Deps.Logger->Debug("Recovery failed and needs more data (rare): Failure rate = ", failRate, " solveFailCount=", solveFailCount, " successCount = ", successCount);

            break;
        }

        if (decodeResult != Siamese_Success)
        {
            Result result = Result("SessionIncoming::decoderAddOriginal", "siamese_decode failed", ErrorType::Siamese, decodeResult);
            Deps.Logger->Error("siamese_decode failed: ", result.ToJson());
            return result;
        }

        //Deps.Logger->Debug("SIAMESE RECOVERED: ", recoveredOriginalCount);

        // Resume processing
        Result result = resumeProcessing();
        if (result.IsFail()) {
            return result;
        }
    }

    return Result::Success();
}